

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditBuildInfoTests.cpp
# Opt level: O0

void __thiscall dit::BuildInfoStringCase::~BuildInfoStringCase(BuildInfoStringCase *this)

{
  BuildInfoStringCase *this_local;
  
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BuildInfoStringCase_004002d8;
  std::__cxx11::string::~string((string *)&this->m_value);
  std::__cxx11::string::~string((string *)&this->m_valueName);
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

BuildInfoStringCase (tcu::TestContext& testCtx, const char* name, const char* valueName, const char* value)
		: tcu::TestCase	(testCtx, name, valueName)
		, m_valueName	(valueName)
		, m_value		(value)
	{
	}